

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::position_to_line(Fl_Text_Display *this,int pos,int *lineNum)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  
  *lineNum = 0;
  if (pos < this->mFirstChar) {
    return 0;
  }
  bVar1 = false;
  do {
    uVar4 = (ulong)(uint)this->mNVisibleLines;
    iVar2 = this->mLastChar;
    if (pos <= iVar2) {
      piVar5 = this->mLineStarts + uVar4;
      do {
        piVar5 = piVar5 + -1;
        if ((int)uVar4 < 1) {
LAB_001d23e5:
          if (bVar1) {
            return 1;
          }
          return 0;
        }
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
      } while (pos < *piVar5 || *piVar5 == -1);
      *lineNum = uVar3;
      iVar2 = 1;
LAB_001d2433:
      if (bVar1) {
        return 1;
      }
      return iVar2;
    }
    if ((this->mNVisibleLines < 1) || (this->mLineStarts[uVar4 - 1] != -1)) goto LAB_001d23e5;
    if (iVar2 < this->mBuffer->mLength) {
      iVar2 = position_to_line(this,iVar2,lineNum);
      if (iVar2 != 0) {
        iVar2 = *lineNum;
        *lineNum = iVar2 + 1;
        if (bVar1) {
          return 1;
        }
        return (uint)(iVar2 < this->mNVisibleLines + -1);
      }
      iVar2 = 0;
      (*Fl::error)("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
      goto LAB_001d2433;
    }
    pos = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,iVar2);
    *lineNum = 0;
    bVar1 = true;
    if (pos < this->mFirstChar) {
      return 1;
    }
  } while( true );
}

Assistant:

int Fl_Text_Display::position_to_line( int pos, int *lineNum ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int i;

  *lineNum = 0;
  if ( pos < mFirstChar ) return 0;
  if ( pos > mLastChar ) {
    if ( empty_vlines() ) {
      if ( mLastChar < mBuffer->length() ) {
        if ( !position_to_line( mLastChar, lineNum ) ) {
          Fl::error("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
          return 0;
        }
        return ++( *lineNum ) <= mNVisibleLines - 1;
      } else {
        position_to_line( buffer()->prev_char_clipped(mLastChar), lineNum );
        return 1;
      }
    }
    return 0;
  }

  for ( i = mNVisibleLines - 1; i >= 0; i-- ) {
    if ( mLineStarts[ i ] != -1 && pos >= mLineStarts[ i ] ) {
      *lineNum = i;
      return 1;
    }
  }
  return 0;   /* probably never be reached */
}